

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *recorder,Hasher *h,VkPipelineLibraryCreateInfoKHR *info)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  Hash hash;
  Hash local_38;
  
  local_38 = 0;
  uVar1 = info->libraryCount;
  h->h = h->h * 0x100000001b3 ^ (ulong)uVar1;
  if ((ulong)uVar1 == 0) {
    bVar2 = true;
  }
  else {
    uVar3 = 0;
    do {
      bVar2 = StateRecorder::get_hash_for_pipeline_library_handle
                        (recorder,info->pLibraries[uVar3],&local_38);
      if (!bVar2) {
        return bVar2;
      }
      h->h = (local_38 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^ local_38 >> 0x20;
      uVar3 = uVar3 + 1;
    } while (uVar3 < info->libraryCount);
  }
  return bVar2;
}

Assistant:

static bool hash_pnext_struct(const StateRecorder *recorder,
                              Hasher &h,
                              const VkPipelineLibraryCreateInfoKHR &info)
{
	Hash hash = 0;
	h.u32(info.libraryCount);

	for (uint32_t i = 0; i < info.libraryCount; i++)
	{
		if (!recorder->get_hash_for_pipeline_library_handle(info.pLibraries[i], &hash))
			return false;
		h.u64(hash);
	}

	return true;
}